

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_statistics.cpp
# Opt level: O1

bool duckdb::HasFilterConstants(TableFilter *duckdb_filter)

{
  TableFilter TVar1;
  unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *puVar2;
  bool bVar3;
  ConstantFilter *pCVar4;
  ConjunctionOrFilter *pCVar5;
  type pTVar6;
  ConjunctionAndFilter *pCVar7;
  byte bVar8;
  unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *child_filter;
  unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *puVar9;
  
  TVar1 = duckdb_filter[8];
  if (TVar1 == (TableFilter)0x4) {
    pCVar7 = TableFilter::Cast<duckdb::ConjunctionAndFilter>(duckdb_filter);
    puVar9 = *(unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> **)
              (pCVar7 + 0x10);
    puVar2 = *(unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> **)
              (pCVar7 + 0x18);
    if (puVar9 != puVar2) {
      bVar8 = 0;
      do {
        pTVar6 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                 operator*(puVar9);
        bVar3 = HasFilterConstants(pTVar6);
        bVar8 = bVar8 | bVar3;
        puVar9 = puVar9 + 1;
      } while (puVar9 != puVar2);
      goto LAB_002b1188;
    }
  }
  else if (TVar1 == (TableFilter)0x3) {
    pCVar5 = TableFilter::Cast<duckdb::ConjunctionOrFilter>(duckdb_filter);
    puVar9 = *(unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> **)
              (pCVar5 + 0x10);
    puVar2 = *(unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> **)
              (pCVar5 + 0x18);
    if (puVar9 != puVar2) {
      bVar8 = 0;
      do {
        pTVar6 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                 operator*(puVar9);
        bVar3 = HasFilterConstants(pTVar6);
        bVar8 = bVar8 | bVar3;
        puVar9 = puVar9 + 1;
      } while (puVar9 != puVar2);
      goto LAB_002b1188;
    }
  }
  else if ((TVar1 == (TableFilter)0x0) &&
          (pCVar4 = TableFilter::Cast<duckdb::ConstantFilter>(duckdb_filter),
          pCVar4[9] == (ConstantFilter)0x19)) {
    bVar8 = (byte)pCVar4[0x28] ^ 1;
    goto LAB_002b1188;
  }
  bVar8 = 0;
LAB_002b1188:
  return (bool)(bVar8 & 1);
}

Assistant:

static bool HasFilterConstants(const TableFilter &duckdb_filter) {
	switch (duckdb_filter.filter_type) {
	case TableFilterType::CONSTANT_COMPARISON: {
		auto &constant_filter = duckdb_filter.Cast<ConstantFilter>();
		return (constant_filter.comparison_type == ExpressionType::COMPARE_EQUAL && !constant_filter.constant.IsNull());
	}
	case TableFilterType::CONJUNCTION_AND: {
		auto &conjunction_and_filter = duckdb_filter.Cast<ConjunctionAndFilter>();
		bool child_has_constant = false;
		for (auto &child_filter : conjunction_and_filter.child_filters) {
			child_has_constant |= HasFilterConstants(*child_filter);
		}
		return child_has_constant;
	}
	case TableFilterType::CONJUNCTION_OR: {
		auto &conjunction_or_filter = duckdb_filter.Cast<ConjunctionOrFilter>();
		bool child_has_constant = false;
		for (auto &child_filter : conjunction_or_filter.child_filters) {
			child_has_constant |= HasFilterConstants(*child_filter);
		}
		return child_has_constant;
	}
	default:
		return false;
	}
}